

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QStringView,QXmlStreamReaderPrivate::Entity>::emplace<QXmlStreamReaderPrivate::Entity_const&>
          (QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *this,QStringView *key,Entity *args)

{
  long lVar1;
  bool bVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity> copy;
  Entity *in_stack_ffffffffffffff28;
  Entity *in_stack_ffffffffffffff30;
  Entity *in_stack_ffffffffffffff38;
  QStringView *in_stack_ffffffffffffff40;
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *in_stack_ffffffffffffff48;
  undefined1 local_58 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::isDetached
                    ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)
                     in_stack_ffffffffffffff30);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::
            shouldGrow((Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)
                       *in_RDI);
    if (bVar2) {
      QXmlStreamReaderPrivate::Entity::Entity(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_58 = (undefined1  [16])
                 QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::
                 emplace_helper<QXmlStreamReaderPrivate::Entity>
                           (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff38);
      QXmlStreamReaderPrivate::Entity::~Entity(in_stack_ffffffffffffff30);
    }
    else {
      local_58 = (undefined1  [16])
                 emplace_helper<QXmlStreamReaderPrivate::Entity_const&>
                           (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff38);
    }
  }
  else {
    QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::QHash
              ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)in_stack_ffffffffffffff30,
               (QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)in_stack_ffffffffffffff28);
    QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::detach
              ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)in_stack_ffffffffffffff30);
    local_58 = (undefined1  [16])
               emplace_helper<QXmlStreamReaderPrivate::Entity_const&>
                         (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
    QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash
              ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)in_stack_ffffffffffffff30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)
                local_58._0_8_;
    iVar3.i.bucket = local_58._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }